

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O1

void log_add_output_stream
               (log_ctx *ctx,log_level min,log_level max,log_formatter_f *default_f,FILE *out_stream
               )

{
  int iVar1;
  log_output *plVar2;
  char *__s;
  long lVar3;
  FILE *__stream;
  
  iVar1 = ctx->out_len;
  __s = (char *)((long)iVar1 + 1);
  ctx->out_len = (int)__s;
  __stream = (FILE *)ctx->out;
  plVar2 = (log_output *)realloc(__stream,((long)iVar1 * 8 + 8) * 3);
  ctx->out = plVar2;
  if (plVar2 != (log_output *)0x0) {
    lVar3 = (long)ctx->out_len;
    plVar2[lVar3 + -1].min = min;
    plVar2[lVar3 + -1].max = max;
    plVar2[lVar3 + -1].stream = out_stream;
    plVar2[lVar3 + -1].f = default_f;
    return;
  }
  log_add_output_stream_cold_1();
  fputs(__s,__stream);
  fflush(__stream);
  return;
}

Assistant:

void log_add_output_stream(struct log_ctx *ctx, /* IN/OUT */
                           enum log_level min,  /* IN */
                           enum log_level max,  /* IN */
                           log_formatter_f * default_f, /* IN */
                           FILE * out_stream)   /* IN */
{
    struct log_output *out;

    ctx->out_len += 1;
    ctx->out = realloc(ctx->out, ctx->out_len * sizeof(*(ctx->out)));
    if (ctx->out == NULL)
    {
        fprintf(stderr,
                "fatal error, can't allocate memory for log output\n");
        exit(1);
    }
    out = &(ctx->out[ctx->out_len - 1]);
    out->min = min;
    out->max = max;
    out->stream = out_stream;
    out->f = default_f;
}